

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GLSL420Pack::TestBase::getStageSpecificLayout(TestBase *this,SHADER_STAGES stage)

{
  char *local_20;
  GLchar *result;
  SHADER_STAGES stage_local;
  TestBase *this_local;
  
  local_20 = "";
  switch(stage) {
  case VERTEX_SHADER:
  case FRAGMENT_SHADER:
    break;
  case TESS_CTRL_SHADER:
    local_20 = getStageSpecificLayout::stage_layout_tess_ctrl;
    break;
  case TESS_EVAL_SHADER:
    local_20 = getStageSpecificLayout::stage_layout_tess_eval;
    break;
  case GEOMETRY_SHADER:
    local_20 = getStageSpecificLayout::stage_layout_geometry;
  }
  return local_20;
}

Assistant:

const GLchar* TestBase::getStageSpecificLayout(Utils::SHADER_STAGES stage) const
{
	static const GLchar* stage_layout_geometry = "layout(points)                           in;\n"
												 "layout(triangle_strip, max_vertices = 4) out;\n";
	static const GLchar* stage_layout_tess_ctrl = "layout(vertices = 1)                     out;\n";
	static const GLchar* stage_layout_tess_eval = "layout(isolines, point_mode)             in;\n";

	const GLchar* result = "";

	switch (stage)
	{
	case Utils::GEOMETRY_SHADER:
		result = stage_layout_geometry;
		break;
	case Utils::TESS_CTRL_SHADER:
		result = stage_layout_tess_ctrl;
		break;
	case Utils::TESS_EVAL_SHADER:
		result = stage_layout_tess_eval;
		break;
	case Utils::VERTEX_SHADER:
	case Utils::FRAGMENT_SHADER:
	default:
		break;
	}

	return result;
}